

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O0

void initialize_regressor<dense_parameters>(vw *all,dense_parameters *weights)

{
  bool bVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  ostream *poVar4;
  undefined8 uVar5;
  dense_parameters *in_RSI;
  long in_RDI;
  stringstream __msg_1;
  stringstream __msg;
  vw_exception *anon_var_0;
  uint32_t ss;
  size_t length;
  dense_parameters *in_stack_fffffffffffffc40;
  size_t in_stack_fffffffffffffc48;
  dense_parameters *in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc64;
  undefined4 in_stack_fffffffffffffc6c;
  undefined4 uVar6;
  vw_exception *in_stack_fffffffffffffc70;
  dense_parameters *in_stack_fffffffffffffc80;
  float *in_stack_fffffffffffffc88;
  dense_parameters *in_stack_fffffffffffffc90;
  dense_parameters *in_stack_fffffffffffffcb8;
  vw *in_stack_fffffffffffffcc0;
  
  bVar1 = dense_parameters::not_null(in_RSI);
  if (!bVar1) {
    uVar2 = dense_parameters::stride_shift(in_RSI);
    dense_parameters::~dense_parameters(in_stack_fffffffffffffc40);
    dense_parameters::dense_parameters
              (in_stack_fffffffffffffc50,in_stack_fffffffffffffc48,
               (uint32_t)((ulong)in_stack_fffffffffffffc40 >> 0x20));
    uVar3 = dense_parameters::mask(in_RSI);
    if (uVar3 == 0) {
      std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffc90);
      poVar4 = std::operator<<((ostream *)&stack0xfffffffffffffca0,
                               " Failed to allocate weight array with ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*(uint *)(in_RDI + 0x50));
      std::operator<<(poVar4," bits: try decreasing -b <bits>");
      uVar6 = CONCAT13(1,(int3)in_stack_fffffffffffffc6c);
      uVar5 = __cxa_allocate_exception(0x38);
      std::__cxx11::stringstream::str();
      VW::vw_exception::vw_exception
                (in_stack_fffffffffffffc70,(char *)CONCAT44(uVar6,uVar2),in_stack_fffffffffffffc64,
                 in_stack_fffffffffffffc58);
      __cxa_throw(uVar5,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
    }
    if ((*(float *)(in_RDI + 0x94) != 0.0) || (NAN(*(float *)(in_RDI + 0x94)))) {
      dense_parameters::set_default<float,set_initial_wrapper<dense_parameters>>
                (in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
    }
    else if ((*(byte *)(in_RDI + 0x3451) & 1) == 0) {
      if ((*(byte *)(in_RDI + 0x3450) & 1) == 0) {
        if ((*(byte *)(in_RDI + 0x3452) & 1) == 0) {
          if ((*(byte *)(in_RDI + 0x3453) & 1) != 0) {
            dense_parameters::set_default<polar_normal_weights_wrapper<dense_parameters>>
                      (in_stack_fffffffffffffc80);
            truncate<dense_parameters>(in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
          }
        }
        else {
          dense_parameters::set_default<polar_normal_weights_wrapper<dense_parameters>>
                    (in_stack_fffffffffffffc80);
        }
      }
      else {
        dense_parameters::set_default<random_weights_wrapper<dense_parameters>>
                  (in_stack_fffffffffffffc80);
      }
    }
    else {
      dense_parameters::set_default<random_positive_wrapper<dense_parameters>>
                (in_stack_fffffffffffffc80);
    }
  }
  return;
}

Assistant:

void initialize_regressor(vw& all, T& weights)
{
  // Regressor is already initialized.

  if (weights.not_null())
    return;
  size_t length = ((size_t)1) << all.num_bits;
  try
  {
    uint32_t ss = weights.stride_shift();
    weights.~T();  // dealloc so that we can realloc, now with a known size
    new (&weights) T(length, ss);
  }
  catch (const VW::vw_exception&)
  {
    THROW(" Failed to allocate weight array with " << all.num_bits << " bits: try decreasing -b <bits>");
  }
  if (weights.mask() == 0)
  {
    THROW(" Failed to allocate weight array with " << all.num_bits << " bits: try decreasing -b <bits>");
  }
  else if (all.initial_weight != 0.)
    weights.template set_default<float, set_initial_wrapper<T> >(all.initial_weight);
  else if (all.random_positive_weights)
    weights.template set_default<random_positive_wrapper<T> >();
  else if (all.random_weights)
    weights.template set_default<random_weights_wrapper<T> >();
  else if (all.normal_weights)
  {
    weights.template set_default<polar_normal_weights_wrapper<T> >();
  }
  else if (all.tnormal_weights)
  {
    weights.template set_default<polar_normal_weights_wrapper<T> >();
    truncate(all, weights);
  }
}